

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.cc
# Opt level: O3

int ASN1_TIME_set_string_X509(ASN1_TIME *s,char *str)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CBS cbs;
  tm tm;
  CBS local_60;
  tm local_50;
  
  local_60.len = strlen(str);
  local_60.data = (uint8_t *)str;
  iVar1 = CBS_parse_utc_time(&local_60,(tm *)0x0,0);
  iVar3 = 0x17;
  if (iVar1 == 0) {
    iVar1 = CBS_parse_generalized_time(&local_60,&local_50,0);
    if (iVar1 == 0) {
      return 0;
    }
    iVar3 = 0x18;
    if (0xffffff9b < local_50.tm_year - 0x96U) {
      CBS_skip(&local_60,2);
      iVar3 = 0x17;
    }
  }
  iVar1 = 1;
  if (s != (ASN1_TIME *)0x0) {
    iVar2 = ASN1_STRING_set((ASN1_STRING *)s,local_60.data,(int)local_60.len);
    if (iVar2 == 0) {
      iVar1 = 0;
    }
    else {
      s->type = iVar3;
    }
  }
  return iVar1;
}

Assistant:

int ASN1_TIME_set_string_X509(ASN1_TIME *s, const char *str) {
  CBS cbs;
  CBS_init(&cbs, (const uint8_t *)str, strlen(str));
  int type;
  struct tm tm;
  if (CBS_parse_utc_time(&cbs, /*out_tm=*/NULL,
                         /*allow_timezone_offset=*/0)) {
    type = V_ASN1_UTCTIME;
  } else if (CBS_parse_generalized_time(&cbs, &tm,
                                        /*allow_timezone_offset=*/0)) {
    type = V_ASN1_GENERALIZEDTIME;
    if (fits_in_utc_time(&tm)) {
      type = V_ASN1_UTCTIME;
      CBS_skip(&cbs, 2);
    }
  } else {
    return 0;
  }

  if (s != NULL) {
    if (!ASN1_STRING_set(s, CBS_data(&cbs), CBS_len(&cbs))) {
      return 0;
    }
    s->type = type;
  }
  return 1;
}